

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_noise_model_get_grain_parameters
              (aom_noise_model_t *noise_model,aom_film_grain_t *film_grain)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined4 *in_RSI;
  long in_RDI;
  double dVar5;
  int i_4;
  aom_equation_system_t *eqns_1;
  int c_3;
  int *ar_coeffs [3];
  double scale_ar_coeff;
  int j;
  double w;
  int i_3;
  double total_weight;
  double average_strength;
  aom_noise_strength_solver_t *solver;
  int i_2;
  aom_equation_system_t *eqns;
  int c_2;
  double avg_luma_strength;
  double y_corr [2];
  double min_coeff;
  double max_coeff;
  int n_coeff;
  int i_1;
  int c_1;
  int (*film_grain_scaling [3]) [2];
  double scale_factor;
  int max_scaling_value_log2;
  int i;
  int c;
  double max_scaling_value;
  double strength_divisor;
  aom_noise_strength_lut_t scaling_points [3];
  uint16_t random_seed;
  double local_198;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  aom_noise_strength_lut_t *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  aom_noise_strength_solver_t *in_stack_fffffffffffffea8;
  double dVar6;
  int local_14c;
  int local_13c;
  undefined4 *local_138 [3];
  double local_120;
  int local_114;
  double local_110;
  int local_104;
  double local_100;
  double local_f8;
  long *local_f0;
  int local_e4;
  long local_e0;
  int local_d4;
  double local_d0;
  double local_c8 [4];
  int local_a4;
  int local_a0;
  int local_9c;
  undefined4 *local_98 [3];
  double local_80;
  int local_74;
  int local_70;
  int local_6c;
  double local_68;
  double local_60;
  long local_58;
  long local_50 [2];
  undefined4 local_40;
  undefined4 local_30;
  undefined2 local_1a;
  undefined4 *local_18;
  long local_10;
  int local_4;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  if (*(int *)(in_RDI + 4) < 4) {
    local_1a = *(undefined2 *)(in_RSI + 0xa1);
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_RSI,0,0x288);
    *(undefined2 *)(local_18 + 0xa1) = local_1a;
    *local_18 = 1;
    local_18[1] = 1;
    local_18[0x4a] = *(undefined4 *)(local_10 + 4);
    iVar2 = aom_noise_strength_solver_fit_piecewise
                      (in_stack_fffffffffffffea8,iVar3,in_stack_fffffffffffffe98);
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      iVar2 = aom_noise_strength_solver_fit_piecewise
                        (in_stack_fffffffffffffea8,iVar3,in_stack_fffffffffffffe98);
      if (iVar2 == 0) {
        aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0x3b9be3);
        local_4 = 0;
      }
      else {
        iVar3 = aom_noise_strength_solver_fit_piecewise
                          (in_stack_fffffffffffffea8,iVar3,in_stack_fffffffffffffe98);
        if (iVar3 == 0) {
          aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0x3b9c32);
          aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0x3b9c43);
          local_4 = 0;
        }
        else {
          local_60 = (double)(1 << ((char)*(undefined4 *)(local_10 + 8) - 8U & 0x1f));
          local_68 = 0.0001;
          for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
            for (local_70 = 0; local_70 < (int)local_50[(long)local_6c * 2]; local_70 = local_70 + 1
                ) {
              if (*(double *)(local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10) / local_60
                  <= 255.0) {
                dVar6 = *(double *)(local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10) /
                        local_60;
              }
              else {
                dVar6 = 255.0;
              }
              *(double *)(local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10) = dVar6;
              if (*(double *)(local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10 + 8) /
                  local_60 <= 255.0) {
                dVar6 = *(double *)(local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10 + 8) /
                        local_60;
              }
              else {
                dVar6 = 255.0;
              }
              *(double *)(local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10 + 8) = dVar6;
              if (local_68 <
                  *(double *)(local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10 + 8)) {
                local_68 = *(double *)
                            (local_50[(long)local_6c * 2 + -1] + (long)local_70 * 0x10 + 8);
              }
            }
          }
          dVar6 = log2(local_68);
          dVar6 = floor(dVar6 + 1.0);
          local_74 = clamp((int)dVar6,2,5);
          local_18[0x49] = 0xd - local_74;
          local_80 = (double)(1 << (8U - (char)local_74 & 0x1f));
          local_18[0x1e] = (undefined4)local_50[0];
          local_18[0x33] = local_40;
          local_18[0x48] = local_30;
          local_98[0] = local_18 + 2;
          local_98[1] = local_18 + 0x1f;
          local_98[2] = local_18 + 0x34;
          for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
            for (local_a0 = 0; local_a0 < (int)local_50[(long)local_9c * 2]; local_a0 = local_a0 + 1
                ) {
              local_98[local_9c][(long)local_a0 * 2] =
                   (int)(*(double *)(local_50[(long)local_9c * 2 + -1] + (long)local_a0 * 0x10) +
                        0.5);
              iVar3 = clamp((int)(local_80 *
                                  *(double *)
                                   (local_50[(long)local_9c * 2 + -1] + (long)local_a0 * 0x10 + 8) +
                                 0.5),0,0xff);
              local_98[local_9c][(long)local_a0 * 2 + 1] = iVar3;
            }
          }
          aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0x3ba154);
          aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0x3ba165);
          aom_noise_strength_lut_free((aom_noise_strength_lut_t *)0x3ba176);
          local_a4 = *(int *)(local_10 + 0x28);
          local_c8[3] = 0.0001;
          local_c8[2] = -0.0001;
          memset(local_c8,0,0x10);
          local_d0 = 0.0;
          for (local_d4 = 0; local_d4 < 3; local_d4 = local_d4 + 1) {
            local_e0 = local_10 + 0x10 + (long)local_d4 * 0x70;
            for (local_e4 = 0; local_e4 < local_a4; local_e4 = local_e4 + 1) {
              pdVar1 = (double *)(*(long *)(local_e0 + 0x10) + (long)local_e4 * 8);
              if (local_c8[3] < *pdVar1 || local_c8[3] == *pdVar1) {
                local_170 = *(double *)(*(long *)(local_e0 + 0x10) + (long)local_e4 * 8);
              }
              else {
                local_170 = local_c8[3];
              }
              local_c8[3] = local_170;
              if (*(double *)(*(long *)(local_e0 + 0x10) + (long)local_e4 * 8) <= local_c8[2]) {
                local_178 = *(double *)(*(long *)(local_e0 + 0x10) + (long)local_e4 * 8);
              }
              else {
                local_178 = local_c8[2];
              }
              local_c8[2] = local_178;
            }
            local_f0 = (long *)(local_10 + (long)local_d4 * 0x70 + 0x30);
            local_f8 = 0.0;
            local_100 = 0.0;
            for (local_104 = 0; local_104 < (int)local_f0[3]; local_104 = local_104 + 1) {
              local_110 = 0.0;
              for (local_114 = 0; local_114 < (int)local_f0[3]; local_114 = local_114 + 1) {
                local_110 = *(double *)
                             (*local_f0 + (long)(local_104 * (int)local_f0[3] + local_114) * 8) +
                            local_110;
              }
              local_110 = sqrt(local_110);
              local_f8 = *(double *)(local_f0[2] + (long)local_104 * 8) * local_110 + local_f8;
              local_100 = local_110 + local_100;
            }
            if ((local_100 != 0.0) || (NAN(local_100))) {
              local_f8 = local_f8 / local_100;
            }
            else {
              local_f8 = 1.0;
            }
            if (local_d4 == 0) {
              local_d0 = local_f8;
            }
            else {
              local_c8[local_d4 + -1] =
                   (local_d0 * *(double *)(*(long *)(local_e0 + 0x10) + (long)local_a4 * 8)) /
                   local_f8;
              if (local_c8[3] < local_c8[local_d4 + -1] || local_c8[3] == local_c8[local_d4 + -1]) {
                local_180 = local_c8[local_d4 + -1];
              }
              else {
                local_180 = local_c8[3];
              }
              local_c8[3] = local_180;
              if (local_c8[local_d4 + -1] <= local_c8[2]) {
                local_188 = local_c8[local_d4 + -1];
              }
              else {
                local_188 = local_c8[2];
              }
              local_c8[2] = local_188;
            }
          }
          dVar6 = log2(local_c8[3]);
          dVar6 = floor(dVar6);
          dVar5 = log2(-local_c8[2]);
          dVar5 = ceil(dVar5);
          if (dVar6 + 1.0 <= dVar5) {
            dVar6 = log2(-local_c8[2]);
            local_198 = ceil(dVar6);
          }
          else {
            dVar6 = log2(local_c8[3]);
            local_198 = floor(dVar6);
            local_198 = local_198 + 1.0;
          }
          iVar3 = clamp(7 - (int)local_198,6,9);
          local_18[0x95] = iVar3;
          local_120 = (double)(1 << ((byte)local_18[0x95] & 0x1f));
          local_138[0] = local_18 + 0x4b;
          local_138[1] = local_18 + 99;
          local_138[2] = local_18 + 0x7c;
          for (local_13c = 0; local_13c < 3; local_13c = local_13c + 1) {
            lVar4 = local_10 + (long)local_13c * 0x70;
            for (local_14c = 0; local_14c < local_a4; local_14c = local_14c + 1) {
              dVar6 = round(local_120 * *(double *)(*(long *)(lVar4 + 0x20) + (long)local_14c * 8));
              iVar3 = clamp((int)dVar6,-0x80,0x7f);
              local_138[local_13c][local_14c] = iVar3;
            }
            if (0 < local_13c) {
              dVar6 = round(local_120 * local_c8[local_13c + -1]);
              iVar3 = clamp((int)dVar6,-0x80,0x7f);
              local_138[local_13c][local_a4] = iVar3;
            }
          }
          local_18[0x96] = 0x80;
          local_18[0x97] = 0xc0;
          local_18[0x98] = 0x100;
          local_18[0x99] = 0x80;
          local_18[0x9a] = 0xc0;
          local_18[0x9b] = 0x100;
          local_18[0x9f] = 0;
          local_18[0xa0] = 0;
          local_18[0x9c] = 1;
          local_4 = 1;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"params.lag = %d > 3\n",(ulong)*(uint *)(in_RDI + 4));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aom_noise_model_get_grain_parameters(aom_noise_model_t *const noise_model,
                                         aom_film_grain_t *film_grain) {
  if (noise_model->params.lag > 3) {
    fprintf(stderr, "params.lag = %d > 3\n", noise_model->params.lag);
    return 0;
  }
  uint16_t random_seed = film_grain->random_seed;
  memset(film_grain, 0, sizeof(*film_grain));
  film_grain->random_seed = random_seed;

  film_grain->apply_grain = 1;
  film_grain->update_parameters = 1;

  film_grain->ar_coeff_lag = noise_model->params.lag;

  // Convert the scaling functions to 8 bit values
  aom_noise_strength_lut_t scaling_points[3];
  if (!aom_noise_strength_solver_fit_piecewise(
          &noise_model->combined_state[0].strength_solver, 14,
          scaling_points + 0)) {
    return 0;
  }
  if (!aom_noise_strength_solver_fit_piecewise(
          &noise_model->combined_state[1].strength_solver, 10,
          scaling_points + 1)) {
    aom_noise_strength_lut_free(scaling_points + 0);
    return 0;
  }
  if (!aom_noise_strength_solver_fit_piecewise(
          &noise_model->combined_state[2].strength_solver, 10,
          scaling_points + 2)) {
    aom_noise_strength_lut_free(scaling_points + 0);
    aom_noise_strength_lut_free(scaling_points + 1);
    return 0;
  }

  // Both the domain and the range of the scaling functions in the film_grain
  // are normalized to 8-bit (e.g., they are implicitly scaled during grain
  // synthesis).
  const double strength_divisor = 1 << (noise_model->params.bit_depth - 8);
  double max_scaling_value = 1e-4;
  for (int c = 0; c < 3; ++c) {
    for (int i = 0; i < scaling_points[c].num_points; ++i) {
      scaling_points[c].points[i][0] =
          AOMMIN(255, scaling_points[c].points[i][0] / strength_divisor);
      scaling_points[c].points[i][1] =
          AOMMIN(255, scaling_points[c].points[i][1] / strength_divisor);
      max_scaling_value =
          AOMMAX(scaling_points[c].points[i][1], max_scaling_value);
    }
  }

  // Scaling_shift values are in the range [8,11]
  const int max_scaling_value_log2 =
      clamp((int)floor(log2(max_scaling_value) + 1), 2, 5);
  film_grain->scaling_shift = 5 + (8 - max_scaling_value_log2);

  const double scale_factor = 1 << (8 - max_scaling_value_log2);
  film_grain->num_y_points = scaling_points[0].num_points;
  film_grain->num_cb_points = scaling_points[1].num_points;
  film_grain->num_cr_points = scaling_points[2].num_points;

  int(*film_grain_scaling[3])[2] = {
    film_grain->scaling_points_y,
    film_grain->scaling_points_cb,
    film_grain->scaling_points_cr,
  };
  for (int c = 0; c < 3; c++) {
    for (int i = 0; i < scaling_points[c].num_points; ++i) {
      film_grain_scaling[c][i][0] = (int)(scaling_points[c].points[i][0] + 0.5);
      film_grain_scaling[c][i][1] = clamp(
          (int)(scale_factor * scaling_points[c].points[i][1] + 0.5), 0, 255);
    }
  }
  aom_noise_strength_lut_free(scaling_points + 0);
  aom_noise_strength_lut_free(scaling_points + 1);
  aom_noise_strength_lut_free(scaling_points + 2);

  // Convert the ar_coeffs into 8-bit values
  const int n_coeff = noise_model->combined_state[0].eqns.n;
  double max_coeff = 1e-4, min_coeff = -1e-4;
  double y_corr[2] = { 0, 0 };
  double avg_luma_strength = 0;
  for (int c = 0; c < 3; c++) {
    aom_equation_system_t *eqns = &noise_model->combined_state[c].eqns;
    for (int i = 0; i < n_coeff; ++i) {
      max_coeff = AOMMAX(max_coeff, eqns->x[i]);
      min_coeff = AOMMIN(min_coeff, eqns->x[i]);
    }
    // Since the correlation between luma/chroma was computed in an already
    // scaled space, we adjust it in the un-scaled space.
    aom_noise_strength_solver_t *solver =
        &noise_model->combined_state[c].strength_solver;
    // Compute a weighted average of the strength for the channel.
    double average_strength = 0, total_weight = 0;
    for (int i = 0; i < solver->eqns.n; ++i) {
      double w = 0;
      for (int j = 0; j < solver->eqns.n; ++j) {
        w += solver->eqns.A[i * solver->eqns.n + j];
      }
      w = sqrt(w);
      average_strength += solver->eqns.x[i] * w;
      total_weight += w;
    }
    if (total_weight == 0)
      average_strength = 1;
    else
      average_strength /= total_weight;
    if (c == 0) {
      avg_luma_strength = average_strength;
    } else {
      y_corr[c - 1] = avg_luma_strength * eqns->x[n_coeff] / average_strength;
      max_coeff = AOMMAX(max_coeff, y_corr[c - 1]);
      min_coeff = AOMMIN(min_coeff, y_corr[c - 1]);
    }
  }
  // Shift value: AR coeffs range (values 6-9)
  // 6: [-2, 2),  7: [-1, 1), 8: [-0.5, 0.5), 9: [-0.25, 0.25)
  film_grain->ar_coeff_shift =
      clamp(7 - (int)AOMMAX(1 + floor(log2(max_coeff)), ceil(log2(-min_coeff))),
            6, 9);
  double scale_ar_coeff = 1 << film_grain->ar_coeff_shift;
  int *ar_coeffs[3] = {
    film_grain->ar_coeffs_y,
    film_grain->ar_coeffs_cb,
    film_grain->ar_coeffs_cr,
  };
  for (int c = 0; c < 3; ++c) {
    aom_equation_system_t *eqns = &noise_model->combined_state[c].eqns;
    for (int i = 0; i < n_coeff; ++i) {
      ar_coeffs[c][i] =
          clamp((int)round(scale_ar_coeff * eqns->x[i]), -128, 127);
    }
    if (c > 0) {
      ar_coeffs[c][n_coeff] =
          clamp((int)round(scale_ar_coeff * y_corr[c - 1]), -128, 127);
    }
  }

  // At the moment, the noise modeling code assumes that the chroma scaling
  // functions are a function of luma.
  film_grain->cb_mult = 128;       // 8 bits
  film_grain->cb_luma_mult = 192;  // 8 bits
  film_grain->cb_offset = 256;     // 9 bits

  film_grain->cr_mult = 128;       // 8 bits
  film_grain->cr_luma_mult = 192;  // 8 bits
  film_grain->cr_offset = 256;     // 9 bits

  film_grain->chroma_scaling_from_luma = 0;
  film_grain->grain_scale_shift = 0;
  film_grain->overlap_flag = 1;
  return 1;
}